

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_client.cpp
# Opt level: O0

void ConnectFunc(Handle *handle,uint32_t err)

{
  uint uVar1;
  element_type *peVar2;
  ostream *poVar3;
  void *pvVar4;
  undefined8 uVar5;
  string local_70 [8];
  string msg;
  ushort local_3a;
  string local_38 [6];
  uint16_t port;
  string ip;
  uint32_t err_local;
  Handle *handle_local;
  
  if (err == 0) {
    std::__cxx11::string::string(local_38);
    peVar2 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    (*peVar2->_vptr_CNSocket[4])(peVar2,local_38,&local_3a);
    poVar3 = std::operator<<((ostream *)&std::cout," [ConnectFunc] : ip : ");
    poVar3 = std::operator<<(poVar3,local_38);
    poVar3 = std::operator<<(poVar3,"port : ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_3a);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    GetMsg_abi_cxx11_();
    peVar2 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    uVar5 = std::__cxx11::string::c_str();
    uVar1 = std::__cxx11::string::length();
    (*peVar2->_vptr_CNSocket[5])(peVar2,uVar5,(ulong)uVar1);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout," [ConnectFunc] some thing error : ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,err);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ConnectFunc(Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        std::string ip;
        uint16_t port;
        handle->GetAddress(ip, port);
        std::cout << " [ConnectFunc] : ip : " << ip << "port : " << port << std::endl;
        auto msg = GetMsg();
        handle->Write(msg.c_str(), (uint32_t)msg.length());

    } else {
        std::cout << " [ConnectFunc] some thing error : " << err << std::endl;
    }
}